

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool crnd::crnd_get_texture_info(void *pData,uint32 data_size,crn_texture_info *pInfo)

{
  int *piVar1;
  uint uVar2;
  crn_header *pcVar3;
  int iVar4;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  uint in_ESI;
  long in_RDI;
  bool bVar5;
  crn_header *pHeader;
  uint32 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  bool local_1;
  
  piVar1 = (int *)CONCAT71(in_register_00000011,in_DL);
  if (((in_RDI == 0) || (in_ESI < 0x4a)) || (piVar1 == (int *)0x0)) {
    local_1 = false;
  }
  else if (*piVar1 == 0x28) {
    pcVar3 = crnd_get_header(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    if (pcVar3 == (crn_header *)0x0) {
      local_1 = false;
    }
    else {
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar3->m_width);
      piVar1[1] = uVar2;
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar3->m_height);
      piVar1[2] = uVar2;
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar3->m_levels);
      piVar1[3] = uVar2;
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar3->m_faces);
      piVar1[4] = uVar2;
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar3->m_format);
      *(ulong *)(piVar1 + 8) = (ulong)uVar2;
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar3->m_format);
      bVar5 = true;
      if (uVar2 != 0) {
        uVar2 = crn_packed_uint::operator_cast_to_unsigned_int((crn_packed_uint *)&pcVar3->m_format)
        ;
        bVar5 = true;
        if (uVar2 != 9) {
          uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                            ((crn_packed_uint *)&pcVar3->m_format);
          bVar5 = true;
          if (uVar2 != 10) {
            uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                              ((crn_packed_uint *)&pcVar3->m_format);
            bVar5 = true;
            if (uVar2 != 0xb) {
              uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                                ((crn_packed_uint *)&pcVar3->m_format);
              bVar5 = uVar2 == 0xd;
            }
          }
        }
      }
      iVar4 = 0x10;
      if (bVar5) {
        iVar4 = 8;
      }
      piVar1[5] = iVar4;
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar3->m_userdata0);
      piVar1[6] = uVar2;
      uVar2 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&pcVar3->m_userdata1);
      piVar1[7] = uVar2;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool crnd_get_texture_info(const void* pData, uint32 data_size, crn_texture_info* pInfo) {
  if ((!pData) || (data_size < sizeof(crn_header)) || (!pInfo))
    return false;

  if (pInfo->m_struct_size != sizeof(crn_texture_info))
    return false;

  const crn_header* pHeader = crnd_get_header(pData, data_size);
  if (!pHeader)
    return false;

  pInfo->m_width = pHeader->m_width;
  pInfo->m_height = pHeader->m_height;
  pInfo->m_levels = pHeader->m_levels;
  pInfo->m_faces = pHeader->m_faces;
  pInfo->m_format = static_cast<crn_format>((uint32)pHeader->m_format);
  pInfo->m_bytes_per_block = pHeader->m_format == cCRNFmtDXT1 || pHeader->m_format == cCRNFmtDXT5A || pHeader->m_format == cCRNFmtETC1 || pHeader->m_format == cCRNFmtETC2 || pHeader->m_format == cCRNFmtETC1S ? 8 : 16;
  pInfo->m_userdata0 = pHeader->m_userdata0;
  pInfo->m_userdata1 = pHeader->m_userdata1;

  return true;
}